

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBoxShape.cpp
# Opt level: O3

void __thiscall chrono::ChBoxShape::ArchiveOUT(ChBoxShape *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::geometry::ChBox> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChBoxShape>(marchive);
  ChVisualShape::ArchiveOUT(&this->super_ChVisualShape,marchive);
  local_28._value = &this->gbox;
  local_28._name = "gbox";
  local_28._flags = '\0';
  ChArchiveOut::out<chrono::geometry::ChBox>(marchive,&local_28);
  return;
}

Assistant:

void ChBoxShape::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChBoxShape>();
    // serialize parent class
    ChVisualShape::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(gbox);
}